

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O1

void __thiscall
Camera::Camera(Camera *this,Vector3f *center,Vector3f *direction,Vector3f *up,int imgW,int imgH)

{
  Vector3f *this_00;
  Vector3f *this_01;
  Vector3f local_48 [2];
  
  this->_vptr_Camera = (_func_int **)&PTR__Camera_001fa808;
  Vector3f::Vector3f(&this->center,0.0);
  this_00 = &this->direction;
  Vector3f::Vector3f(this_00,0.0);
  Vector3f::Vector3f(&this->up,0.0);
  this_01 = &this->horizontal;
  Vector3f::Vector3f(this_01,0.0);
  Vector3f::operator=(&this->center,center);
  Vector3f::normalized(local_48);
  Vector3f::operator=(this_00,local_48);
  Vector3f::cross(this_00,up);
  Vector3f::normalized(local_48);
  Vector3f::operator=(this_01,local_48);
  Vector3f::cross(this_01,this_00);
  Vector3f::operator=(&this->up,local_48);
  this->width = imgW;
  this->height = imgH;
  return;
}

Assistant:

Camera(const Vector3f& center, const Vector3f& direction, const Vector3f& up, int imgW, int imgH) {
		this->center = center;
		this->direction = direction.normalized();
		this->horizontal = Vector3f::cross(this->direction, up).normalized();
		this->up = Vector3f::cross(this->horizontal, this->direction);
		this->width = imgW;
		this->height = imgH;
	}